

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

WordTagger * __thiscall CoreML::Specification::Model::mutable_wordtagger(Model *this)

{
  WordTagger *this_00;
  
  if (this->_oneof_case_[0] == 0x7d1) {
    this_00 = (WordTagger *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x7d1;
    this_00 = (WordTagger *)operator_new(0x58);
    CoreMLModels::WordTagger::WordTagger(this_00);
    (this->Type_).wordtagger_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::CoreMLModels::WordTagger* Model::mutable_wordtagger() {
  if (!has_wordtagger()) {
    clear_Type();
    set_has_wordtagger();
    Type_.wordtagger_ = new ::CoreML::Specification::CoreMLModels::WordTagger;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.wordTagger)
  return Type_.wordtagger_;
}